

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::beta_dist<float>::icdf(beta_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  float fVar2;
  result_type_conflict1 rVar3;
  
  rVar3 = 0.0;
  if ((x < 0.0) || (1.0 < x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    rVar3 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    rVar3 = 1.0;
    if ((x != 1.0) || (NAN(x))) {
      fVar2 = math::detail::inv_Beta_I<float>(x,(this->P).alpha_,(this->P).beta_,(this->P).norm_);
      return fVar2;
    }
  }
  return rVar3;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return 1;
      return math::inv_Beta_I(x, P.alpha(), P.beta(), P.norm());
    }